

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::AvgState<duckdb::hugeint_t>,int,duckdb::IntegerAverageOperationHugeint>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  int iVar1;
  int *piVar2;
  AvgState<duckdb::hugeint_t> *state;
  AvgState<duckdb::hugeint_t> **states_00;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  ulong uVar10;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      piVar2 = *(int **)(input + 0x20);
      state = (AvgState<duckdb::hugeint_t> *)**(undefined8 **)(states + 0x20);
      state->count = state->count + count;
      AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,int>(state,*piVar2,count);
      return;
    }
  }
  else {
    if (*input == (Vector)0x0 && *states == (Vector)0x0) {
      piVar2 = *(int **)(input + 0x20);
      states_00 = *(AvgState<duckdb::hugeint_t> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::AvgState<duckdb::hugeint_t>,int,duckdb::IntegerAverageOperationHugeint>
                (piVar2,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_b0 == 0) {
      if (count != 0) {
        lVar3 = *local_c0;
        lVar4 = *local_78;
        iVar7 = 0;
        do {
          iVar9 = iVar7;
          if (lVar3 != 0) {
            iVar9 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
          }
          iVar8 = iVar7;
          if (lVar4 != 0) {
            iVar8 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
          }
          plVar5 = *(long **)(local_70 + iVar8 * 8);
          *plVar5 = *plVar5 + 1;
          iVar1 = *(int *)(local_b8 + iVar9 * 4);
          uVar10 = (ulong)iVar1;
          lVar6 = plVar5[1];
          plVar5[1] = lVar6 + uVar10;
          if (-1 < (long)uVar10 != uVar10 <= lVar6 + uVar10) {
            plVar5[2] = plVar5[2] + (ulong)(-1 < iVar1) * 2 + -1;
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      lVar3 = *local_c0;
      lVar4 = *local_78;
      iVar7 = 0;
      do {
        iVar9 = iVar7;
        if (lVar3 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
        }
        iVar8 = iVar7;
        if (lVar4 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
        }
        if ((*(ulong *)(local_b0 + (iVar9 >> 6) * 8) >> (iVar9 & 0x3f) & 1) != 0) {
          plVar5 = *(long **)(local_70 + iVar8 * 8);
          *plVar5 = *plVar5 + 1;
          iVar1 = *(int *)(local_b8 + iVar9 * 4);
          uVar10 = (ulong)iVar1;
          lVar6 = plVar5[1];
          plVar5[1] = lVar6 + uVar10;
          if (-1 < (long)uVar10 != uVar10 <= lVar6 + uVar10) {
            plVar5[2] = plVar5[2] + (ulong)(-1 < iVar1) * 2 + -1;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}